

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O1

QString * QNetworkInterfaceManager::interfaceNameFromIndex
                    (QString *__return_storage_ptr__,uint index)

{
  int __fd;
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  uint *puVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  ifreq req;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint local_48 [4];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __fd = ::socket(2,0x80002,0);
  if (-1 < __fd) {
    local_48[1] = 0xaaaaaaaa;
    local_48[2] = 0xaaaaaaaa;
    local_48[3] = 0xaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaa;
    uStack_54 = 0xaaaaaaaa;
    uStack_50 = 0xaaaaaaaa;
    uStack_4c = 0xaaaaaaaa;
    local_48[0] = index;
    iVar1 = ioctl(__fd,0x8910,&local_58);
    if (iVar1 < 0) {
      do {
        iVar2 = ::close(__fd);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    }
    else {
      do {
        iVar2 = ::close(__fd);
        if (iVar2 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      puVar4 = (uint *)memchr(&local_58,0,0x10);
      puVar5 = local_48;
      if (puVar4 != (uint *)0x0) {
        puVar5 = puVar4;
      }
      QVar6.m_data = (storage_type *)((long)puVar5 - (long)&local_58);
      QVar6.m_size = (qsizetype)__return_storage_ptr__;
      QString::fromLatin1(QVar6);
    }
    if (-1 < iVar1) goto LAB_002348d6;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_002348d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QNetworkInterfaceManager::interfaceNameFromIndex(uint index)
{
    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = index;

        if (qt_safe_ioctl(socket, SIOCGIFNAME, &req) >= 0) {
            qt_safe_close(socket);
            return QString::fromLatin1(req.ifr_name);
        }
        qt_safe_close(socket);
    }
    return QString();
}